

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int mbedtls_x509_get_time(uchar **p,uchar *end,mbedtls_x509_time *time)

{
  byte *pbVar1;
  uchar *puVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  size_t len;
  ulong local_18;
  
  puVar2 = *p;
  local_18 = (long)end - (long)puVar2;
  if ((long)local_18 < 1) {
    return -0x2460;
  }
  if (*puVar2 == '\x18') {
    *p = puVar2 + 1;
    iVar3 = mbedtls_asn1_get_len(p,end,&local_18);
    if (iVar3 != 0) goto LAB_00167797;
    time->year = 0;
    puVar2 = *p;
    lVar6 = 0;
    do {
      bVar4 = puVar2[lVar6] - 0x30;
      if (9 < bVar4) {
        iVar3 = -0x2400;
        goto LAB_00167847;
      }
      pbVar1 = puVar2 + lVar6;
      iVar3 = time->year * 10;
      time->year = iVar3;
      *p = pbVar1 + 1;
      time->year = (uint)*pbVar1 + iVar3 + -0x30;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 4);
    iVar3 = 0;
LAB_00167847:
    if (9 < bVar4) {
      return iVar3;
    }
    time->mon = 0;
    puVar2 = *p;
    lVar6 = 0;
    do {
      bVar4 = puVar2[lVar6] - 0x30;
      if (9 < bVar4) {
        iVar3 = -0x2400;
        goto LAB_001678fb;
      }
      pbVar1 = puVar2 + lVar6;
      iVar3 = time->mon * 10;
      time->mon = iVar3;
      *p = pbVar1 + 1;
      time->mon = (uint)*pbVar1 + iVar3 + -0x30;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 2);
    iVar3 = 0;
LAB_001678fb:
    if (9 < bVar4) {
      return iVar3;
    }
    time->day = 0;
    puVar2 = *p;
    lVar6 = 0;
    do {
      bVar4 = puVar2[lVar6] - 0x30;
      if (9 < bVar4) {
        iVar3 = -0x2400;
        goto LAB_001679af;
      }
      pbVar1 = puVar2 + lVar6;
      iVar3 = time->day * 10;
      time->day = iVar3;
      *p = pbVar1 + 1;
      time->day = (uint)*pbVar1 + iVar3 + -0x30;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 2);
    iVar3 = 0;
LAB_001679af:
    if (9 < bVar4) {
      return iVar3;
    }
    time->hour = 0;
    puVar2 = *p;
    lVar6 = 0;
    do {
      bVar4 = puVar2[lVar6] - 0x30;
      if (9 < bVar4) {
        iVar3 = -0x2400;
        goto LAB_00167a63;
      }
      pbVar1 = puVar2 + lVar6;
      iVar3 = time->hour * 10;
      time->hour = iVar3;
      *p = pbVar1 + 1;
      time->hour = (uint)*pbVar1 + iVar3 + -0x30;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 2);
    iVar3 = 0;
LAB_00167a63:
    if (9 < bVar4) {
      return iVar3;
    }
    time->min = 0;
    puVar2 = *p;
    lVar6 = 0;
    do {
      bVar4 = puVar2[lVar6] - 0x30;
      if (9 < bVar4) {
        iVar3 = -0x2400;
        goto LAB_00167b28;
      }
      pbVar1 = puVar2 + lVar6;
      iVar3 = time->min * 10;
      time->min = iVar3;
      *p = pbVar1 + 1;
      time->min = (uint)*pbVar1 + iVar3 + -0x30;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 2);
    iVar3 = 0;
LAB_00167b28:
    if (9 < bVar4) {
      return iVar3;
    }
    if (0xc < local_18) {
      time->sec = 0;
      puVar2 = *p;
      lVar6 = 0;
      do {
        bVar4 = puVar2[lVar6] - 0x30;
        if (9 < bVar4) {
          iVar3 = -0x2400;
          goto LAB_00167bd2;
        }
        pbVar1 = puVar2 + lVar6;
        iVar3 = time->sec * 10;
        time->sec = iVar3;
        *p = pbVar1 + 1;
        time->sec = (uint)*pbVar1 + iVar3 + -0x30;
        lVar6 = lVar6 + 1;
      } while ((int)lVar6 != 2);
      iVar3 = 0;
LAB_00167bd2:
      if (9 < bVar4) {
        return iVar3;
      }
    }
    if ((0xe < local_18) && (puVar2 = *p, *p = puVar2 + 1, *puVar2 != 'Z')) {
      return -0x2400;
    }
  }
  else {
    if (*puVar2 != '\x17') {
      return -0x2462;
    }
    *p = puVar2 + 1;
    iVar3 = mbedtls_asn1_get_len(p,end,&local_18);
    if (iVar3 != 0) {
LAB_00167797:
      return iVar3 + -0x2400;
    }
    time->year = 0;
    puVar2 = *p;
    lVar6 = 0;
    do {
      bVar4 = puVar2[lVar6] - 0x30;
      if (9 < bVar4) {
        iVar3 = -0x2400;
        goto LAB_001677f1;
      }
      pbVar1 = puVar2 + lVar6;
      iVar3 = time->year * 10;
      time->year = iVar3;
      *p = pbVar1 + 1;
      time->year = (uint)*pbVar1 + iVar3 + -0x30;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 2);
    iVar3 = 0;
LAB_001677f1:
    if (9 < bVar4) {
      return iVar3;
    }
    time->mon = 0;
    puVar2 = *p;
    lVar6 = 0;
    do {
      bVar4 = puVar2[lVar6] - 0x30;
      if (9 < bVar4) {
        iVar3 = -0x2400;
        goto LAB_001678a1;
      }
      pbVar1 = puVar2 + lVar6;
      iVar3 = time->mon * 10;
      time->mon = iVar3;
      *p = pbVar1 + 1;
      time->mon = (uint)*pbVar1 + iVar3 + -0x30;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 2);
    iVar3 = 0;
LAB_001678a1:
    if (9 < bVar4) {
      return iVar3;
    }
    time->day = 0;
    puVar2 = *p;
    lVar6 = 0;
    do {
      bVar4 = puVar2[lVar6] - 0x30;
      if (9 < bVar4) {
        iVar3 = -0x2400;
        goto LAB_00167955;
      }
      pbVar1 = puVar2 + lVar6;
      iVar3 = time->day * 10;
      time->day = iVar3;
      *p = pbVar1 + 1;
      time->day = (uint)*pbVar1 + iVar3 + -0x30;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 2);
    iVar3 = 0;
LAB_00167955:
    if (9 < bVar4) {
      return iVar3;
    }
    time->hour = 0;
    puVar2 = *p;
    lVar6 = 0;
    do {
      bVar4 = puVar2[lVar6] - 0x30;
      if (9 < bVar4) {
        iVar3 = -0x2400;
        goto LAB_00167a09;
      }
      pbVar1 = puVar2 + lVar6;
      iVar3 = time->hour * 10;
      time->hour = iVar3;
      *p = pbVar1 + 1;
      time->hour = (uint)*pbVar1 + iVar3 + -0x30;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 2);
    iVar3 = 0;
LAB_00167a09:
    if (9 < bVar4) {
      return iVar3;
    }
    time->min = 0;
    puVar2 = *p;
    lVar6 = 0;
    do {
      bVar4 = puVar2[lVar6] - 0x30;
      if (9 < bVar4) {
        iVar3 = -0x2400;
        goto LAB_00167abd;
      }
      pbVar1 = puVar2 + lVar6;
      iVar3 = time->min * 10;
      time->min = iVar3;
      *p = pbVar1 + 1;
      time->min = (uint)*pbVar1 + iVar3 + -0x30;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 2);
    iVar3 = 0;
LAB_00167abd:
    if (9 < bVar4) {
      return iVar3;
    }
    if (10 < local_18) {
      time->sec = 0;
      puVar2 = *p;
      lVar6 = 0;
      do {
        bVar4 = puVar2[lVar6] - 0x30;
        if (9 < bVar4) {
          iVar3 = -0x2400;
          goto LAB_00167b8f;
        }
        pbVar1 = puVar2 + lVar6;
        iVar3 = time->sec * 10;
        time->sec = iVar3;
        *p = pbVar1 + 1;
        time->sec = (uint)*pbVar1 + iVar3 + -0x30;
        lVar6 = lVar6 + 1;
      } while ((int)lVar6 != 2);
      iVar3 = 0;
LAB_00167b8f:
      if (9 < bVar4) {
        return iVar3;
      }
    }
    if ((0xc < local_18) && (puVar2 = *p, *p = puVar2 + 1, *puVar2 != 'Z')) {
      return -0x2400;
    }
    iVar3 = time->year;
    iVar5 = iVar3 + 100;
    if (0x31 < iVar3) {
      iVar5 = iVar3;
    }
    time->year = iVar5 + 0x76c;
  }
  return 0;
}

Assistant:

int mbedtls_x509_get_time( unsigned char **p, const unsigned char *end,
                   mbedtls_x509_time *time )
{
    int ret;
    size_t len;
    unsigned char tag;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    tag = **p;

    if( tag == MBEDTLS_ASN1_UTC_TIME )
    {
        (*p)++;
        ret = mbedtls_asn1_get_len( p, end, &len );

        if( ret != 0 )
            return( MBEDTLS_ERR_X509_INVALID_DATE + ret );

        CHECK( x509_parse_int( p, 2, &time->year ) );
        CHECK( x509_parse_int( p, 2, &time->mon ) );
        CHECK( x509_parse_int( p, 2, &time->day ) );
        CHECK( x509_parse_int( p, 2, &time->hour ) );
        CHECK( x509_parse_int( p, 2, &time->min ) );
        if( len > 10 )
            CHECK( x509_parse_int( p, 2, &time->sec ) );
        if( len > 12 && *(*p)++ != 'Z' )
            return( MBEDTLS_ERR_X509_INVALID_DATE );

        time->year +=  100 * ( time->year < 50 );
        time->year += 1900;

        return( 0 );
    }
    else if( tag == MBEDTLS_ASN1_GENERALIZED_TIME )
    {
        (*p)++;
        ret = mbedtls_asn1_get_len( p, end, &len );

        if( ret != 0 )
            return( MBEDTLS_ERR_X509_INVALID_DATE + ret );

        CHECK( x509_parse_int( p, 4, &time->year ) );
        CHECK( x509_parse_int( p, 2, &time->mon ) );
        CHECK( x509_parse_int( p, 2, &time->day ) );
        CHECK( x509_parse_int( p, 2, &time->hour ) );
        CHECK( x509_parse_int( p, 2, &time->min ) );
        if( len > 12 )
            CHECK( x509_parse_int( p, 2, &time->sec ) );
        if( len > 14 && *(*p)++ != 'Z' )
            return( MBEDTLS_ERR_X509_INVALID_DATE );

        return( 0 );
    }
    else
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );
}